

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O0

int Au_NtkCheckRecursive(Au_Ntk_t *pNtk)

{
  int iVar1;
  Vec_Ptr_t *p;
  Au_Ntk_t *p_00;
  Au_Obj_t *p_01;
  Au_Ntk_t *pAVar2;
  char *pcVar3;
  int local_3c;
  int local_38;
  int RetValue;
  int k;
  int i;
  Au_Obj_t *pObj;
  Au_Ntk_t *pModel;
  Vec_Ptr_t *vMods;
  Au_Ntk_t *pNtk_local;
  
  local_3c = 0;
  if (pNtk->pMan == (Au_Man_t *)0x0) {
    printf("There is no hierarchy information.\n");
    pNtk_local._4_4_ = 0;
  }
  else {
    p = &pNtk->pMan->vNtks;
    for (RetValue = 1; iVar1 = Vec_PtrSize(p), RetValue < iVar1; RetValue = RetValue + 1) {
      p_00 = (Au_Ntk_t *)Vec_PtrEntry(p,RetValue);
      for (local_38 = 0; iVar1 = Vec_IntSize(&p_00->vObjs), local_38 < iVar1;
          local_38 = local_38 + 1) {
        p_01 = Au_NtkObjI(p_00,local_38);
        iVar1 = Au_ObjIsBox(p_01);
        if ((iVar1 != 0) && (pAVar2 = Au_ObjModel(p_01), pAVar2 == p_00)) {
          pcVar3 = Au_NtkName(p_00);
          printf("WARNING: Model \"%s\" contains a recursive definition.\n",pcVar3);
          local_3c = 1;
          break;
        }
      }
    }
    pNtk_local._4_4_ = local_3c;
  }
  return pNtk_local._4_4_;
}

Assistant:

int Au_NtkCheckRecursive( Au_Ntk_t * pNtk )
{
    Vec_Ptr_t * vMods;
    Au_Ntk_t * pModel;
    Au_Obj_t * pObj;
    int i, k, RetValue = 0;

    if ( pNtk->pMan == NULL )
    {
        printf( "There is no hierarchy information.\n" );
        return RetValue;
    }

    vMods = &pNtk->pMan->vNtks;
    Vec_PtrForEachEntryStart( Au_Ntk_t *, vMods, pModel, i, 1 )
    {
        Au_NtkForEachObj( pModel, pObj, k )
            if ( Au_ObjIsBox(pObj) && Au_ObjModel(pObj) == pModel )
            {
                printf( "WARNING: Model \"%s\" contains a recursive definition.\n", Au_NtkName(pModel) );
                RetValue = 1;
                break;
            }
    }
    return RetValue;
}